

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subqueryref.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundSubqueryRef *ref)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  bool bVar1;
  Binder *pBVar2;
  long in_RDX;
  
  bVar1 = *(bool *)((long)&ref[0xb].super_BoundTableRef.sample.
                           super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                   + 1);
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x18);
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  pBVar2->is_outside_flattened = bVar1;
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0x28));
  CreatePlan(this,(BoundQueryNode *)pBVar2);
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  if (pBVar2->has_unplanned_dependent_joins == true) {
    *(undefined1 *)
     &ref[0xb].super_BoundTableRef.sample.
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = 1;
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundSubqueryRef &ref) {
	// generate the logical plan for the subquery
	// this happens separately from the current LogicalPlan generation
	ref.binder->is_outside_flattened = is_outside_flattened;
	auto subquery = ref.binder->CreatePlan(*ref.subquery);
	if (ref.binder->has_unplanned_dependent_joins) {
		has_unplanned_dependent_joins = true;
	}
	return subquery;
}